

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestInitMessageBuilder::~TestInitMessageBuilder
          (TestInitMessageBuilder *this)

{
  Array<capnp::word> *pAVar1;
  RemoveConst<kj::Array<capnp::word>_> *pRVar2;
  Array<capnp::word> *pAVar3;
  ArrayDisposer *pAVar4;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__TestInitMessageBuilder_0036b060;
  pAVar1 = (this->allocations).builder.ptr;
  if (pAVar1 != (Array<capnp::word> *)0x0) {
    pRVar2 = (this->allocations).builder.pos;
    pAVar3 = (this->allocations).builder.endPtr;
    (this->allocations).builder.ptr = (Array<capnp::word> *)0x0;
    (this->allocations).builder.pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
    (this->allocations).builder.endPtr = (Array<capnp::word> *)0x0;
    pAVar4 = (this->allocations).builder.disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               kj::ArrayDisposer::Dispose_<kj::Array<capnp::word>_>::destruct);
  }
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

TestInitMessageBuilder(kj::ArrayPtr<SegmentInit> segments): MessageBuilder(segments) {}